

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiDockNode *pIVar3;
  ImDrawList *draw_list;
  ImVec2 IVar4;
  undefined1 auVar5 [16];
  char *label_00;
  bool bVar6;
  bool bVar7;
  char cVar8;
  short sVar9;
  ImU32 id;
  uint uVar10;
  ImU32 col;
  uint uVar11;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar12;
  size_t sVar13;
  ImGuiWindow *extraout_RAX;
  undefined7 uVar16;
  undefined8 extraout_RAX_00;
  char *pcVar15;
  ImS8 IVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  ImGuiCol idx;
  long lVar22;
  ImGuiTabItem *pIVar23;
  undefined1 uVar24;
  ImGuiContext *ctx;
  undefined1 auVar25 [4];
  float fVar26;
  float fVar27;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar28;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar29;
  ImVec2 IVar30;
  ImVec2 IVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  bool text_clipped;
  bool just_closed;
  uint local_ac;
  undefined8 local_a8;
  uint local_9c;
  ImRect bb;
  bool held;
  float local_6c;
  ImGuiContext *local_68;
  bool hovered;
  undefined7 uStack_5f;
  float fStack_5c;
  undefined1 local_58 [4];
  undefined1 auStack_54 [12];
  char *local_48;
  bool *local_40;
  ImVec2 local_38;
  ImGuiWindow *pIVar14;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  local_68 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label,docked_window);
  if (p_open != (bool *)0x0) {
    if (*p_open == false) {
      PushItemFlag(0x18,true);
      bb.Min.x = 0.0;
      bb.Min.y = 0.0;
      bb.Max.x = 0.0;
      bb.Max.y = 0.0;
      ItemAdd(&bb,id,(ImRect *)0x0);
      PopItemFlag();
      return false;
    }
    if (((uint)flags >> 0x15 & 1) != 0) {
      __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                    ,0x1da8,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
  }
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x1da9,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  local_40 = (bool *)0x0;
  uVar20 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_40 = p_open;
    uVar20 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar20 = flags;
  }
  IVar4 = TabItemCalcSize(label,local_40 != (bool *)0x0);
  auVar25 = (undefined1  [4])IVar4.x;
  fVar27 = IVar4.y;
  uVar11 = (tab_bar->Tabs).Size;
  uVar28 = extraout_XMM0_Dc;
  uVar29 = extraout_XMM0_Dd;
  local_ac = uVar20;
  if (0 < (int)uVar11 && id != 0) {
    pIVar12 = (tab_bar->Tabs).Data;
    lVar22 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar12->ID + lVar22) == id) {
        pIVar23 = (ImGuiTabItem *)((long)&pIVar12->ID + lVar22);
        bVar6 = false;
        goto LAB_0016e267;
      }
      lVar22 = lVar22 + 0x30;
    } while ((ulong)uVar11 * 0x30 != lVar22);
  }
  if (uVar11 == (tab_bar->Tabs).Capacity) {
    auStack_54._4_4_ = extraout_XMM0_Dc;
    local_58 = (undefined1  [4])IVar4.x;
    auStack_54._0_4_ = IVar4.y;
    auStack_54._8_4_ = extraout_XMM0_Dd;
    if (uVar11 == 0) {
      iVar18 = 8;
    }
    else {
      iVar18 = (int)uVar11 / 2 + uVar11;
    }
    iVar19 = uVar11 + 1;
    if ((int)(uVar11 + 1) < iVar18) {
      iVar19 = iVar18;
    }
    pIVar12 = (ImGuiTabItem *)MemAlloc((long)iVar19 * 0x30);
    pIVar23 = (tab_bar->Tabs).Data;
    if (pIVar23 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar12,pIVar23,(long)(tab_bar->Tabs).Size * 0x30);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar12;
    (tab_bar->Tabs).Capacity = iVar19;
    uVar11 = (tab_bar->Tabs).Size;
    auVar25 = local_58;
    fVar27 = (float)auStack_54._0_4_;
    uVar28 = auStack_54._4_4_;
    uVar29 = auStack_54._8_4_;
  }
  else {
    pIVar12 = (tab_bar->Tabs).Data;
  }
  pIVar23 = pIVar12 + (int)uVar11;
  pIVar23->ID = 0;
  pIVar23->Flags = 0;
  pIVar23->Window = (ImGuiWindow *)0x0;
  pIVar12[(int)uVar11].LastFrameVisible = -1;
  pIVar12[(int)uVar11].LastFrameSelected = -1;
  pIVar23 = pIVar12 + (int)uVar11;
  pIVar23->ContentWidth = 0.0;
  pIVar23->NameOffset = -1;
  pIVar23->BeginOrder = -1;
  pIVar12[(int)uVar11].Offset = 0.0;
  pIVar12[(int)uVar11].Width = 0.0;
  pIVar12[(int)uVar11].IndexDuringLayout = -1;
  *(undefined4 *)&pIVar12[(int)uVar11].WantClose = 0;
  *(undefined2 *)&pIVar12[(int)uVar11].field_0x2e = 0;
  iVar18 = (tab_bar->Tabs).Size;
  uVar11 = iVar18 + 1;
  (tab_bar->Tabs).Size = uVar11;
  if (iVar18 < 0) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                  ,0x5cc,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
  }
  pIVar12 = (tab_bar->Tabs).Data;
  pIVar23 = pIVar12 + ((ulong)uVar11 - 1);
  pIVar23->ID = id;
  pIVar12[(ulong)uVar11 - 1].Width = (float)auVar25;
  tab_bar->TabsAddedNew = true;
  bVar6 = true;
LAB_0016e267:
  local_48 = label;
  if ((pIVar23 < pIVar12) || (pIVar12 + (int)uVar11 <= pIVar23)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                  ,0x5e3,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar23 - (int)pIVar12) >> 4) * -0x5555;
  pIVar23->ContentWidth = (float)auVar25;
  sVar9 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar9 + 1;
  pIVar23->BeginOrder = sVar9;
  uVar20 = tab_bar->Flags;
  iVar18 = tab_bar->PrevFrameVisible;
  iVar19 = local_68->FrameCount;
  iVar21 = pIVar23->LastFrameVisible;
  pIVar23->LastFrameVisible = iVar19;
  pIVar23->Flags = local_ac;
  pIVar23->Window = docked_window;
  if (docked_window == (ImGuiWindow *)0x0) {
    iVar1 = (tab_bar->TabsNames).Buf.Size;
    sVar9 = (short)iVar1 + -1;
    if (iVar1 == 0) {
      sVar9 = 0;
    }
    pIVar23->NameOffset = sVar9;
    local_a8 = CONCAT44(local_a8._4_4_,id);
    auStack_54._0_4_ = fVar27;
    local_58 = auVar25;
    auStack_54._4_4_ = uVar28;
    auStack_54._8_4_ = uVar29;
    local_9c = uVar20;
    sVar13 = strlen(label);
    ctx = local_68;
    uVar11 = local_ac;
    ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar13 + 1);
    pIVar14 = extraout_RAX;
    fVar27 = (float)auStack_54._0_4_;
    id = (ImGuiID)local_a8;
    uVar20 = local_9c;
  }
  else {
    if ((uVar20 >> 0x14 & 1) == 0) {
      __assert_fail("tab_bar->Flags & ImGuiTabBarFlags_DockNode",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                    ,0x1dd0,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
    pIVar23->NameOffset = -1;
    pIVar14 = docked_window;
    ctx = local_68;
    uVar11 = local_ac;
  }
  iVar18 = iVar18 + 1;
  iVar21 = iVar21 + 1;
  if (((iVar21 < iVar19) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar18 < iVar19) {
      uVar10 = uVar11 & 0x200000 | tab_bar->SelectedTabId;
      pIVar14 = (ImGuiWindow *)(ulong)uVar10;
    }
    else {
      uVar10 = uVar11 >> 0x15 & 1;
    }
    if (uVar10 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  if ((((uVar11 & 2) != 0) && (tab_bar->SelectedTabId != id)) &&
     (pIVar14 = (ImGuiWindow *)(ulong)(uVar11 & 0x200000), (uVar11 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  uVar16 = (undefined7)((ulong)pIVar14 >> 8);
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    local_a8 = CONCAT71(uVar16,1);
  }
  else {
    local_a8 = 0;
    if (((tab_bar->SelectedTabId == 0) && (docked_window == (ImGuiWindow *)0x0)) &&
       (iVar18 < iVar19)) {
      if ((tab_bar->Tabs).Size == 1) {
        local_a8 = CONCAT71(uVar16,(tab_bar->Flags & 2) == 0);
      }
      else {
        local_a8 = 0;
      }
    }
  }
  if ((iVar21 < iVar19) && (bVar6 || iVar19 <= iVar18)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return (bool)((uVar11 >> 0x15 & 1) == 0 & (byte)local_a8);
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar23->LastFrameSelected = ctx->FrameCount;
  }
  uVar11 = pIVar23->Flags;
  fVar26 = pIVar23->Width;
  fVar34 = pIVar23->Offset;
  if ((uVar11 & 0xc0) == 0) {
    fVar34 = (float)(int)(fVar34 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar34 + (tab_bar->BarRect).Min.x;
  IVar4 = (pIVar2->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar30.y = bb.Min.y;
  IVar30.x = bb.Min.x;
  (pIVar2->DC).CursorPos = IVar30;
  fVar26 = fVar26 + bb.Min.x;
  fVar27 = fVar27 + bb.Min.y;
  bb.Max.y = fVar27;
  bb.Max.x = fVar26;
  local_9c = uVar20;
  if ((uVar11 & 0xc0) == 0) {
    fVar34 = tab_bar->ScrollingRectMinX;
    if ((fVar34 <= bb.Min.x) && (fVar26 <= tab_bar->ScrollingRectMaxX)) goto LAB_0016e4ae;
    fStack_5c = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar34 <= bb.Min.x) & (uint)fVar34 |
                      (uint)bb.Min.x & -(uint)(fVar34 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_6c = fVar27;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    fVar26 = bb.Max.x;
    fVar27 = bb.Max.y;
    local_58 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
  }
  else {
LAB_0016e4ae:
    auVar5._12_4_ = 0;
    auVar5._0_12_ = auStack_54;
    _local_58 = auVar5 << 0x20;
  }
  IVar30 = (pIVar2->DC).CursorMaxPos;
  fStack_5c = fVar27 - bb.Min.y;
  _hovered = fVar26 - bb.Min.x;
  ItemSize((ImVec2 *)&hovered,(ctx->Style).FramePadding.y);
  (pIVar2->DC).CursorMaxPos = IVar30;
  bVar6 = ItemAdd(&bb,id,(ImRect *)0x0);
  if (!bVar6) {
    if (local_58[0] != '\0') {
      PopClipRect();
    }
    (pIVar2->DC).CursorPos = IVar4;
    return (bool)(char)local_a8;
  }
  uVar20 = (local_ac >> 0x11 & 0x10) + 0x1010;
  local_38 = IVar4;
  if (ctx->DragDropActive == true) {
    if ((ctx->DragDropPayload).DataFrameCount == -1) {
      uVar20 = uVar20 | 0x200;
    }
    else {
      iVar18 = strcmp("_IMWINDOW",(ctx->DragDropPayload).DataType);
      if (iVar18 != 0) {
        uVar20 = uVar20 | 0x200;
      }
    }
  }
  uVar11 = local_ac >> 0x15;
  bVar6 = ButtonBehavior(&bb,id,&hovered,&held,uVar20);
  uVar20 = local_ac;
  if ((uVar11 & 1) == 0 && bVar6) {
    tab_bar->NextSelectedTabId = id;
  }
  hovered = (bool)(hovered | ctx->HoveredId == id);
  if (((held == true && docked_window != (ImGuiWindow *)0x0) && (ctx->ActiveId == id)) &&
     (ctx->ActiveIdIsJustActivated == true)) {
    ctx->ActiveIdWindow = docked_window;
  }
  if (held == false) {
    SetItemAllowOverlap();
  }
  if (((((docked_window == (ImGuiWindow *)0x0) ||
        (pIVar3 = docked_window->DockNode, pIVar3 == (ImGuiDockNode *)0x0)) ||
       ((pIVar3->ParentNode != (ImGuiDockNode *)0x0 ||
        (((pIVar3->LocalFlags & 0x400U) != 0 || (held != true)))))) || ((pIVar3->Windows).Size != 1)
      ) || (bVar7 = IsMouseDragging(0,0.0), !bVar7)) {
    if (((held == true) && (iVar19 <= iVar21)) && (bVar7 = IsMouseDragging(0,-1.0), bVar7)) {
      bVar7 = ctx->DragDropActive;
      fVar27 = 0.0;
      if (bVar7 != false) goto LAB_0016e73a;
      uVar11 = tab_bar->Flags;
      if (docked_window == (ImGuiWindow *)0x0 && (uVar11 & 1) == 0) goto LAB_0016e8dd;
      fVar26 = (ctx->IO).MouseDelta.x;
      if (0.0 <= fVar26) {
LAB_0016eaef:
        if (0.0 < fVar26) {
          fVar26 = (ctx->IO).MousePos.x;
          if ((bb.Max.x < fVar26) && (fVar27 = fVar26 - bb.Max.x, (uVar11 & 1) != 0)) {
            IVar17 = '\x01';
            goto LAB_0016eb1b;
          }
        }
      }
      else {
        fVar34 = (ctx->IO).MousePos.x;
        if (bb.Min.x <= fVar34) goto LAB_0016eaef;
        fVar27 = bb.Min.x - fVar34;
        if ((uVar11 & 1) == 0) goto LAB_0016e73a;
        IVar17 = -1;
LAB_0016eb1b:
        if (tab_bar->ReorderRequestTabId != 0) {
          __assert_fail("tab_bar->ReorderRequestTabId == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                        ,0x1cc4,
                        "void ImGui::TabBarQueueReorder(ImGuiTabBar *, const ImGuiTabItem *, int)");
        }
        tab_bar->ReorderRequestTabId = pIVar23->ID;
        tab_bar->ReorderRequestDir = IVar17;
      }
LAB_0016e73a:
      if ((docked_window != (ImGuiWindow *)0x0) && ((docked_window->Flags & 4) == 0)) {
        if ((bVar7 == false) || ((ctx->DragDropPayload).SourceId != id)) {
          fVar26 = ctx->FontSize;
          fVar32 = (ABS((ctx->IO).MouseDragMaxDistanceAbs[0].x) - (fVar26 + fVar26)) * 0.2;
          fVar34 = fVar26 * 4.0;
          if (fVar32 <= fVar26 * 4.0) {
            fVar34 = fVar32;
          }
          fVar35 = (ctx->IO).MousePos.y;
          fVar33 = bb.Min.y - fVar35;
          fVar35 = fVar35 - bb.Max.y;
          uVar11 = -(uint)(fVar35 <= fVar33);
          if ((float)(~uVar11 & (uint)fVar35 | (uint)fVar33 & uVar11) <
              fVar26 * 1.5 + (float)(~-(uint)(fVar32 < 0.0) & (uint)fVar34)) {
            if (fVar26 * 2.2 < fVar27) {
              cVar8 = tab_bar->ReorderRequestDir;
              if (cVar8 < '\0') {
                iVar18 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar23);
                if (iVar18 == 0) goto LAB_0016e833;
                cVar8 = tab_bar->ReorderRequestDir;
              }
              if (('\0' < cVar8) &&
                 (iVar18 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar23),
                 iVar18 == (tab_bar->Tabs).Size + -1)) goto LAB_0016e833;
            }
            goto LAB_0016e8dd;
          }
        }
LAB_0016e833:
        DockContextQueueUndockWindow(ctx,docked_window);
        ctx->MovingWindow = docked_window;
        SetActiveID(docked_window->MoveId,docked_window);
        IVar4 = ctx->MovingWindow->Pos;
        IVar31.x = (ctx->ActiveIdClickOffset).x - (IVar4.x - bb.Min.x);
        IVar31.y = (ctx->ActiveIdClickOffset).y - (IVar4.y - bb.Min.y);
        ctx->ActiveIdClickOffset = IVar31;
        ctx->ActiveIdNoClearOnFocusLoss = true;
      }
    }
  }
  else {
    StartMouseMovingWindow(docked_window);
  }
LAB_0016e8dd:
  label_00 = local_48;
  draw_list = pIVar2->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if ((byte)local_a8 == '\0') {
      idx = (uint)((local_9c >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_9c >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,uVar20,col);
  RenderNavHighlight(&bb,id,1);
  bVar7 = IsItemHovered(8);
  if (bVar7) {
    bVar7 = IsMouseClicked(1,false);
    if (bVar7) {
      uVar11 = uVar20 >> 0x15 & 1;
    }
    else {
      bVar7 = IsMouseReleased(1);
      if (!bVar7) goto LAB_0016e9a9;
      uVar11 = uVar20 & 0x200000;
    }
    if (uVar11 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_0016e9a9:
  uVar11 = tab_bar->Flags;
  if (local_40 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar11 >> 1 & 4 | uVar20,tab_bar->FramePadding,label_00,id,
             close_button_id,SUB81(local_a8,0),&just_closed,&text_clipped);
  if ((local_40 != (bool *)0x0) && (just_closed != false)) {
    *local_40 = false;
    TabBarCloseTab(tab_bar,pIVar23);
  }
  if (local_58[0] != '\0') {
    PopClipRect();
  }
  (pIVar2->DC).CursorPos = local_38;
  if (((((text_clipped == true) && (local_68->HoveredId == id)) && (held == false)) &&
      ((0.5 < local_68->HoveredIdNotActiveTimer && (bVar7 = IsItemHovered(0), bVar7)))) &&
     (((tab_bar->Flags & 0x20) == 0 && ((pIVar23->Flags & 0x10) == 0)))) {
    pcVar15 = FindRenderedTextEnd(label_00,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar15 - (int)label_00),label_00);
  }
  uVar24 = (char)local_a8;
  if (((uVar20 >> 0x15 & 1) != 0) && (uVar24 = bVar6, tab_bar->SelectedTabId == pIVar23->ID)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x1e9c,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  return (bool)uVar24;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label, docked_window);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    // (regular tabs are permitted in a DockNode tab bar, but window tabs not permitted in a non-DockNode tab bar)
    if (tab->Window != NULL)
    {
        IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_DockNode);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = (ImS16)tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW))
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Transfer active id window so the active id is not owned by the dock host (as StartMouseMovingWindow()
    // will only do it on the drag). This allows FocusWindow() to be more conservative in how it clears active id.
    if (held && docked_window && g.ActiveId == id && g.ActiveIdIsJustActivated)
        g.ActiveIdWindow = docked_window;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, +1);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);

            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                //float threshold_base = g.IO.ConfigDockingWithShift ? g.FontSize * 0.5f : g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                else if (drag_distance_from_edge_x > threshold_x)
                    if ((tab_bar->ReorderRequestDir < 0 && tab_bar->GetTabOrder(tab) == 0) || (tab_bar->ReorderRequestDir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                SetActiveID(g.MovingWindow->MoveId, g.MovingWindow);
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
                g.ActiveIdNoClearOnFocusLoss = true;
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}